

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scenario.cpp
# Opt level: O2

void __thiscall
multi_agent_planning::Scenario::Scenario
          (Scenario *this,
          vector<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>,_std::allocator<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>_>
          *actions,vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>_>
                   *graphs,int numConflicts,int numSynergies)

{
  vector<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
  *this_00;
  int iVar1;
  pointer pvVar2;
  pointer peVar3;
  pointer ppVar4;
  int *piVar5;
  unsigned_long uVar6;
  unsigned_long uVar7;
  undefined8 uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  iterator iVar12;
  mapped_type *pmVar13;
  int iVar14;
  ulong uVar15;
  pointer peVar16;
  value_type local_118;
  undefined4 uStack_d0;
  undefined4 local_cc;
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  property_type *local_bc;
  int iStack_b4;
  undefined4 local_b0;
  undefined4 uStack_ac;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  property_type *local_a0;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  generated;
  Graph g;
  
  std::
  vector<std::map<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>,_std::less<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>_>_>_>,_std::allocator<std::map<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>,_std::less<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>_>_>_>_>_>
  ::vector(&this->interactionMaps,
           ((long)(actions->
                  super__Vector_base<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>,_std::allocator<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
           (long)(actions->
                 super__Vector_base<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>,_std::allocator<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start) / 0x18,(allocator_type *)&local_118);
  this_00 = &this->allActions;
  (this->allActions).
  super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->allActions).
  super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->allActions).
  super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (uVar15 = 0;
      pvVar2 = (actions->
               super__Vector_base<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>,_std::allocator<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar15 < (ulong)(((long)(actions->
                              super__Vector_base<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>,_std::allocator<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2) / 0x18);
      uVar15 = uVar15 + 1) {
    peVar3 = *(pointer *)
              ((long)&pvVar2[uVar15].
                      super__Vector_base<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data + 8);
    for (peVar16 = pvVar2[uVar15].
                   super__Vector_base<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; peVar16 != peVar3;
        peVar16 = peVar16 + 1) {
      local_118.agentA = (int)uVar15;
      local_118.actionA.m_eproperty = peVar16->m_eproperty;
      uVar6 = (peVar16->super_edge_base<boost::directed_tag,_unsigned_long>).m_source;
      uVar7 = (peVar16->super_edge_base<boost::directed_tag,_unsigned_long>).m_target;
      local_118.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_source._0_4_ =
           (undefined4)uVar6;
      local_118.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_source._4_4_ =
           (undefined4)(uVar6 >> 0x20);
      local_118.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_target._0_4_ =
           (undefined4)uVar7;
      local_118.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_target._4_4_ =
           (undefined4)(uVar7 >> 0x20);
      std::
      vector<std::pair<int,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>>,std::allocator<std::pair<int,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>>>>
      ::
      emplace_back<std::pair<int,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>>>
                ((vector<std::pair<int,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>>,std::allocator<std::pair<int,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>>>>
                  *)this_00,
                 (pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_> *)
                 &local_118);
    }
  }
  generated._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &generated._M_t._M_impl.super__Rb_tree_header._M_header;
  generated._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  generated._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  generated._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar14 = 0;
  if (numConflicts < 1) {
    numConflicts = 0;
  }
  generated._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       generated._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (; iVar14 != numConflicts; iVar14 = iVar14 + 1) {
    do {
      do {
        iVar9 = getRndInt((int)((ulong)((long)(this->allActions).
                                              super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(this->allActions).
                                             super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 5) + -1);
        iVar10 = getRndInt((int)((ulong)((long)(this->allActions).
                                               super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(this->allActions).
                                              super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 5) + -1)
        ;
        ppVar4 = (this_00->
                 super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      } while (ppVar4[iVar9].first == ppVar4[iVar10].first);
      local_118.agentA = iVar9;
      local_118._4_4_ = iVar10;
      iVar12 = std::
               _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
               ::find(&generated._M_t,(key_type *)&local_118);
    } while ((_Rb_tree_header *)iVar12._M_node != &generated._M_t._M_impl.super__Rb_tree_header);
    local_118.agentA = iVar9;
    local_118._4_4_ = iVar10;
    std::
    _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
    ::_M_insert_unique<std::pair<int,int>>
              ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                *)&generated,(pair<int,_int> *)&local_118);
    ppVar4 = (this_00->
             super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    piVar5 = (int *)ppVar4[iVar10].second.m_eproperty;
    boost::
    adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>
    ::adjacency_list(&g,(graphs->
                        super__Vector_base<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + ppVar4[iVar10].first);
    iVar1 = *piVar5;
    do {
      iVar11 = getRndInt(iVar1);
    } while (iVar11 == 0);
    ppVar4 = (this->allActions).
             super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_118.agentA = ppVar4[iVar9].first;
    local_118.agentB = ppVar4[iVar10].first;
    local_118.actionA.m_eproperty = ppVar4[iVar9].second.m_eproperty;
    uVar8 = ppVar4[iVar9].second.super_edge_base<boost::directed_tag,_unsigned_long>.m_source;
    uVar6 = ppVar4[iVar9].second.super_edge_base<boost::directed_tag,_unsigned_long>.m_target;
    local_b0 = (undefined4)uVar8;
    uStack_ac = (undefined4)((ulong)uVar8 >> 0x20);
    uStack_a8 = (undefined4)uVar6;
    uStack_a4 = (undefined4)(uVar6 >> 0x20);
    local_118.actionB.m_eproperty = ppVar4[iVar10].second.m_eproperty;
    uVar8 = ppVar4[iVar10].second.super_edge_base<boost::directed_tag,_unsigned_long>.m_source;
    uVar6 = ppVar4[iVar10].second.super_edge_base<boost::directed_tag,_unsigned_long>.m_target;
    local_cc = (undefined4)uVar8;
    uStack_c8 = (undefined4)((ulong)uVar8 >> 0x20);
    uStack_c4 = (undefined4)uVar6;
    uStack_c0 = (undefined4)(uVar6 >> 0x20);
    local_118._4_4_ = iStack_b4;
    local_118.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_source._0_4_ = local_b0;
    local_118.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_source._4_4_ = uStack_ac
    ;
    local_118.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_target._0_4_ = uStack_a8
    ;
    local_118.actionB.super_edge_base<boost::directed_tag,_unsigned_long>.m_source._0_4_ = local_cc;
    local_118._36_4_ = uStack_d0;
    local_118.actionB.super_edge_base<boost::directed_tag,_unsigned_long>.m_source._4_4_ = uStack_c8
    ;
    local_118.actionB.super_edge_base<boost::directed_tag,_unsigned_long>.m_target._0_4_ = uStack_c4
    ;
    local_118.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_target._4_4_ = uStack_a4
    ;
    local_118.actionB.super_edge_base<boost::directed_tag,_unsigned_long>.m_target._4_4_ = uStack_c0
    ;
    local_118.cost = iVar11;
    local_bc = local_118.actionB.m_eproperty;
    local_a0 = local_118.actionA.m_eproperty;
    pmVar13 = std::
              map<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>,_std::less<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>_>_>_>
              ::operator[]((this->interactionMaps).
                           super__Vector_base<std::map<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>,_std::less<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>_>_>_>,_std::allocator<std::map<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>,_std::less<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + local_118.agentA,
                           &local_118.actionA);
    std::
    vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>::
    push_back(pmVar13,&local_118);
    boost::
    adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>
    ::~adjacency_list(&g);
  }
  iVar14 = 0;
  if (numSynergies < 1) {
    numSynergies = 0;
  }
  for (; iVar14 != numSynergies; iVar14 = iVar14 + 1) {
    do {
      do {
        iVar9 = getRndInt((int)((ulong)((long)(this->allActions).
                                              super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(this->allActions).
                                             super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 5) + -1);
        iVar10 = getRndInt((int)((ulong)((long)(this->allActions).
                                               super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(this->allActions).
                                              super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 5) + -1)
        ;
        ppVar4 = (this_00->
                 super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      } while (ppVar4[iVar9].first == ppVar4[iVar10].first);
      local_118.agentA = iVar9;
      local_118._4_4_ = iVar10;
      iVar12 = std::
               _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
               ::find(&generated._M_t,(key_type *)&local_118);
    } while ((_Rb_tree_header *)iVar12._M_node != &generated._M_t._M_impl.super__Rb_tree_header);
    local_118.agentA = iVar9;
    local_118._4_4_ = iVar10;
    std::
    _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
    ::_M_insert_unique<std::pair<int,int>>
              ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                *)&generated,(pair<int,_int> *)&local_118);
    ppVar4 = (this_00->
             super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    piVar5 = (int *)ppVar4[iVar10].second.m_eproperty;
    boost::
    adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>
    ::adjacency_list(&g,(graphs->
                        super__Vector_base<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + ppVar4[iVar10].first);
    iVar1 = *piVar5;
    do {
      iVar11 = getRndInt(-iVar1,0);
    } while (iVar11 == 0);
    ppVar4 = (this->allActions).
             super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_118.agentA = ppVar4[iVar9].first;
    local_118.agentB = ppVar4[iVar10].first;
    local_118.actionA.m_eproperty = ppVar4[iVar9].second.m_eproperty;
    uVar8 = ppVar4[iVar9].second.super_edge_base<boost::directed_tag,_unsigned_long>.m_source;
    uVar6 = ppVar4[iVar9].second.super_edge_base<boost::directed_tag,_unsigned_long>.m_target;
    local_b0 = (undefined4)uVar8;
    uStack_ac = (undefined4)((ulong)uVar8 >> 0x20);
    uStack_a8 = (undefined4)uVar6;
    uStack_a4 = (undefined4)(uVar6 >> 0x20);
    local_118.actionB.m_eproperty = ppVar4[iVar10].second.m_eproperty;
    uVar8 = ppVar4[iVar10].second.super_edge_base<boost::directed_tag,_unsigned_long>.m_source;
    uVar6 = ppVar4[iVar10].second.super_edge_base<boost::directed_tag,_unsigned_long>.m_target;
    local_cc = (undefined4)uVar8;
    uStack_c8 = (undefined4)((ulong)uVar8 >> 0x20);
    uStack_c4 = (undefined4)uVar6;
    uStack_c0 = (undefined4)(uVar6 >> 0x20);
    local_118._4_4_ = iStack_b4;
    local_118.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_source._0_4_ = local_b0;
    local_118.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_source._4_4_ = uStack_ac
    ;
    local_118.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_target._0_4_ = uStack_a8
    ;
    local_118.actionB.super_edge_base<boost::directed_tag,_unsigned_long>.m_source._0_4_ = local_cc;
    local_118._36_4_ = uStack_d0;
    local_118.actionB.super_edge_base<boost::directed_tag,_unsigned_long>.m_source._4_4_ = uStack_c8
    ;
    local_118.actionB.super_edge_base<boost::directed_tag,_unsigned_long>.m_target._0_4_ = uStack_c4
    ;
    local_118.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_target._4_4_ = uStack_a4
    ;
    local_118.actionB.super_edge_base<boost::directed_tag,_unsigned_long>.m_target._4_4_ = uStack_c0
    ;
    local_118.cost = iVar11;
    local_bc = local_118.actionB.m_eproperty;
    local_a0 = local_118.actionA.m_eproperty;
    pmVar13 = std::
              map<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>,_std::less<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>_>_>_>
              ::operator[]((this->interactionMaps).
                           super__Vector_base<std::map<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>,_std::less<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>_>_>_>,_std::allocator<std::map<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>,_std::less<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + local_118.agentA,
                           &local_118.actionA);
    std::
    vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>::
    push_back(pmVar13,&local_118);
    boost::
    adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>
    ::~adjacency_list(&g);
  }
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  ::~_Rb_tree(&generated._M_t);
  return;
}

Assistant:

Scenario::Scenario(const vector<std::vector<Edge> >& actions, 
									const vector<Graph>& graphs, 
									int numConflicts,
									int numSynergies) : 
		interactionMaps(actions.size()), allActions() {

	for (int i = 0; i < actions.size(); ++i) {
		transform(actions[i].begin(), actions[i].end(), 
							back_inserter(allActions), 
							[i](const Edge& e){return make_pair(i, e);});
	}

	set<pair<int, int> > generated;

	for (int i = 0; i < numConflicts; ++i) {

		int actA, actB;
		
		do {
			actA = getRndInt(allActions.size()-1);
			actB = getRndInt(allActions.size()-1);
		} while ((allActions[actA].first == allActions[actB].first) || 
					  (generated.find(make_pair(actA, actB)) != generated.end()));

		generated.insert(make_pair(actA, actB));
 
 		std::pair<int, Edge> action = allActions[actB];

 		Graph g = graphs[action.first];
 		int cost = g[action.second].cost;

 		int interactionCost;
 		do {
 			interactionCost = getRndInt(cost);
 		} while (interactionCost == 0);

		Interaction interaction(allActions[actA], allActions[actB], interactionCost);
		insertInteraction(interaction);
	}

	for (int i = 0; i < numSynergies; ++i) {

		int actA, actB;
		
		do {
			actA = getRndInt(allActions.size()-1);
			actB = getRndInt(allActions.size()-1);
		} while ((allActions[actA].first == allActions[actB].first) || 
					  (generated.find(make_pair(actA, actB)) != generated.end()));

		generated.insert(make_pair(actA, actB));
 
 		std::pair<int, Edge> action = allActions[actB];

 		Graph g = graphs[action.first];
 		int cost = g[action.second].cost;

 		int interactionCost;
 		do {
 			interactionCost = getRndInt(-cost, 0);
 		} while (interactionCost == 0);

		Interaction interaction(allActions[actA], allActions[actB], interactionCost);
		insertInteraction(interaction);
	}
	
}